

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O1

void __thiscall symbol_table_visitor::visit(symbol_table_visitor *this,Assignment *ptr)

{
  string *psVar1;
  symbol_table_visitor *this_00;
  
  (**(ptr->lvalue->super_Base)._vptr_Base)(ptr->lvalue,this);
  this_00 = (symbol_table_visitor *)ptr->rvalue;
  (**((Base *)&this_00->super_Visitor)->_vptr_Base)(this_00,this);
  if (ptr->lvalue->is_lvalue != false) {
    assert_type(this_00,ptr->rvalue->type,ptr->lvalue->type);
    return;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar1,"syntax error: not lvalue in left part of assignment","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::visit(Assignment* ptr) {
    ptr->lvalue->accept(this);
    ptr->rvalue->accept(this);
    if (!ptr->lvalue->is_lvalue) {
        throw std::string("syntax error: not lvalue in left part of assignment");
    }
    assert_type(ptr->rvalue->type, ptr->lvalue->type);
}